

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acm.cpp
# Opt level: O1

void __thiscall intel_acm_t::header_t::~header_t(header_t *this)

{
  ~header_t(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

intel_acm_t::header_t::~header_t() {
    _clean_up();
}